

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_2::ValidateAccessChain(ValidationState_t *_,Instruction *inst)

{
  long lVar1;
  uint16_t uVar2;
  ushort uVar3;
  uint32_t id;
  pointer puVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int32_t iVar8;
  char *pcVar9;
  long *plVar10;
  Instruction *pIVar11;
  Instruction *pIVar12;
  DiagnosticStream *pDVar13;
  long *plVar14;
  ulong uVar15;
  long lVar16;
  size_t index;
  _func_int **pp_Var17;
  spv_result_t sVar18;
  ulong uVar19;
  string instr_name;
  int64_t cur_index;
  long *local_280;
  long local_270;
  long lStack_268;
  Instruction *local_260;
  string local_258;
  long local_238;
  long local_230;
  string local_228;
  undefined1 *local_208 [2];
  long local_1f8 [56];
  spv_result_t local_38;
  
  pcVar9 = spvOpcodeString((uint)*(ushort *)
                                  ((long)&(inst->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 2));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_208,pcVar9,(allocator<char> *)&local_258);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0x8f49b8);
  local_280 = &local_270;
  plVar14 = plVar10 + 2;
  if ((long *)*plVar10 == plVar14) {
    local_270 = *plVar14;
    lStack_268 = plVar10[3];
  }
  else {
    local_270 = *plVar14;
    local_280 = (long *)*plVar10;
  }
  lVar16 = plVar10[1];
  *plVar10 = (long)plVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if (local_208[0] != &((DiagnosticStream *)local_208)->field_0x10) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  bVar5 = spvOpcodeGeneratesUntypedPointer
                    ((uint)*(ushort *)
                            ((long)&(inst->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 2));
  pIVar11 = ValidationState_t::FindDef
                      (_,*(uint32_t *)
                          &(inst->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
  if (bVar5) {
    if ((pIVar11 == (Instruction *)0x0) || ((pIVar11->inst_).opcode != 0x1141)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"The Result Type of ",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_280,lVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_
                (&local_258,_,
                 *(uint32_t *)
                  ((long)&(inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," must be OpTypeUntypedPointerKHR. Found Op",0x2a);
      local_228._M_dataplus._M_p = spvOpcodeString((uint)(pIVar11->inst_).opcode);
      pDVar13 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_228);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar13,".",1);
      sVar18 = pDVar13->error_;
LAB_00646420:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
LAB_0064643f:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      goto LAB_006467da;
    }
    uVar7 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
    pIVar12 = ValidationState_t::FindDef(_,uVar7);
    if ((((pIVar12 != (Instruction *)0x0) &&
         (iVar8 = spvOpcodeGeneratesType((uint)(pIVar12->inst_).opcode), iVar8 != 0)) &&
        (uVar2 = (pIVar12->inst_).opcode, uVar2 != 0x1141)) && (index = 3, uVar2 != 0x20))
    goto LAB_00646105;
    ValidationState_t::diag
              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
    pcVar9 = "Base type must be a non-pointer type";
    lVar16 = 0x24;
LAB_006467be:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar9,lVar16);
    sVar18 = local_38;
  }
  else {
    if ((pIVar11 != (Instruction *)0x0) && (index = 2, (pIVar11->inst_).opcode == 0x20)) {
LAB_00646105:
      uVar7 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,index);
      pIVar12 = ValidationState_t::FindDef(_,uVar7);
      pIVar12 = ValidationState_t::FindDef(_,(pIVar12->inst_).type_id);
      if (pIVar12 == (Instruction *)0x0) {
LAB_00646386:
        ValidationState_t::diag
                  ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"The Base <id> ",0xe);
        ValidationState_t::getIdName_abi_cxx11_(&local_258,_,uVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," in ",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,(char *)local_280,lVar16);
        pcVar9 = " instruction must be a pointer.";
        lVar16 = 0x1f;
LAB_00646409:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar9,lVar16);
        sVar18 = local_38;
        goto LAB_00646420;
      }
      uVar2 = (pIVar12->inst_).opcode;
      if (uVar2 == 0x20) {
        puVar4 = (pIVar12->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((pIVar11->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[2] == puVar4[2]) {
          if (bVar5) {
LAB_00646336:
            uVar7 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
          }
          else {
            uVar7 = puVar4[3];
          }
          pIVar12 = ValidationState_t::FindDef(_,uVar7);
          pp_Var17 = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                     _vptr_IntrusiveNodeBase;
          uVar15 = (long)(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ -
                   (long)pp_Var17 >> 2;
          uVar3 = *(ushort *)
                   ((long)&(inst->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start + 2);
          if (uVar3 - 0x1147 < 2) {
LAB_0064637d:
            uVar19 = uVar15 - 5;
LAB_006464bc:
            if (uVar19 <= (_->options_->universal_limits_).max_access_chain_indexes) {
              uVar7 = bVar5 | 4;
              if ((uVar3 - 0x1147 < 2) || (uVar3 == 0x46)) {
LAB_0064656e:
                uVar7 = uVar7 + 1;
              }
              uVar19 = (ulong)uVar7;
              local_260 = pIVar12;
              if (uVar19 < uVar15) {
                do {
                  id = *(uint32_t *)((long)pp_Var17 + uVar19 * 4);
                  pIVar12 = ValidationState_t::FindDef(_,id);
                  pIVar12 = ValidationState_t::FindDef(_,(pIVar12->inst_).type_id);
                  if ((pIVar12 == (Instruction *)0x0) || ((pIVar12->inst_).opcode != 0x15)) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,
                               (Instruction *)inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,"Indexes passed to ",0x12);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,(char *)local_280,lVar16);
                    pcVar9 = " must be of type integer.";
                    lVar16 = 0x19;
                    goto LAB_006467be;
                  }
                  uVar3 = (local_260->inst_).opcode;
                  uVar7 = (uint)uVar3;
                  if (0x1167 < uVar3) {
                    if (uVar7 == 0x14a7 || uVar3 < 0x14a7) {
                      if ((uVar7 == 0x1168) || (uVar7 == 0x13d4)) {
LAB_006465d2:
                        uVar7 = (local_260->words_).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[2];
                        goto LAB_006465d8;
                      }
                    }
                    else if ((uVar7 == 0x14ee) || (uVar7 == 0x14a8)) goto LAB_006465d2;
LAB_00646806:
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,
                               (Instruction *)inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,(char *)local_280,lVar16);
                    pcVar9 = 
                    " reached non-composite type while indexes still remain to be traversed.";
                    lVar16 = 0x47;
                    goto LAB_006467be;
                  }
                  if (0x1e < uVar7) goto LAB_00646806;
                  if ((0x31800000U >> (uVar7 & 0x1f) & 1) != 0) goto LAB_006465d2;
                  if (uVar7 != 0x1e) goto LAB_00646806;
                  bVar6 = ValidationState_t::EvalConstantValInt64(_,id,&local_238);
                  pIVar12 = local_260;
                  if (!bVar6) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,
                               (Instruction *)inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,"The <id> passed to ",0x13);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,(char *)local_280,lVar16);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208," to index ",10);
                    ValidationState_t::getIdName_abi_cxx11_(&local_258,_,id);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,local_258._M_dataplus._M_p,
                               local_258._M_string_length);
                    pcVar9 = " into a structure must be an OpConstant.";
                    lVar16 = 0x28;
                    goto LAB_00646409;
                  }
                  puVar4 = (local_260->words_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  lVar1 = ((long)(local_260->words_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2) + -2
                  ;
                  if ((local_238 < 0) || (lVar1 <= local_238)) {
                    local_230 = lVar1;
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,
                               (Instruction *)inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,"Index ",6);
                    ValidationState_t::getIdName_abi_cxx11_(&local_258,_,id);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,local_258._M_dataplus._M_p,
                               local_258._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208," is out of bounds: ",0x13);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,(char *)local_280,lVar16);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208," cannot find index ",0x13);
                    std::ostream::_M_insert<long>((long)local_208);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208," into the structure <id> ",0x19);
                    ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar12->inst_).result_id)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,local_228._M_dataplus._M_p,
                               local_228._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,". This structure has ",0x15);
                    std::ostream::_M_insert<long>((long)local_208);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208," members. Largest valid index is ",0x21);
                    std::ostream::_M_insert<long>((long)local_208);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,".",1);
                    sVar18 = local_38;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_228._M_dataplus._M_p != &local_228.field_2) {
                      operator_delete(local_228._M_dataplus._M_p,
                                      local_228.field_2._M_allocated_capacity + 1);
                    }
                    goto LAB_00646420;
                  }
                  uVar7 = puVar4[local_238 + 2];
LAB_006465d8:
                  local_260 = ValidationState_t::FindDef(_,uVar7);
                  uVar19 = uVar19 + 1;
                  pp_Var17 = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                             _vptr_IntrusiveNodeBase;
                } while (uVar19 < (ulong)((long)(inst->
                                                super_IntrusiveNodeBase<spvtools::opt::Instruction>)
                                                .next_node_ - (long)pp_Var17 >> 2));
              }
              sVar18 = SPV_SUCCESS;
              if ((bVar5) ||
                 (pIVar12 = ValidationState_t::FindDef
                                      (_,(pIVar11->words_).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start[3]),
                 pIVar11 = local_260, (local_260->inst_).result_id == (pIVar12->inst_).result_id))
              goto LAB_006467da;
              ValidationState_t::diag
                        ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,(char *)local_280,lVar16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208," result type (Op",0x10);
              local_258._M_dataplus._M_p = spvOpcodeString((uint)(pIVar12->inst_).opcode);
              pDVar13 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)local_208,(char **)&local_258);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar13,
                         ") does not match the type that results from indexing into the base <id> (Op"
                         ,0x4b);
              local_228._M_dataplus._M_p = spvOpcodeString((uint)(pIVar11->inst_).opcode);
              pDVar13 = DiagnosticStream::operator<<(pDVar13,(char **)&local_228);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar13,").",2);
              sVar18 = pDVar13->error_;
              goto LAB_0064643f;
            }
          }
          else {
            if (uVar3 != 0x43) {
              if (uVar3 == 0x46) goto LAB_0064637d;
              uVar19 = uVar15 - 4;
              goto LAB_006464bc;
            }
            if (uVar15 - 5 <= (ulong)(_->options_->universal_limits_).max_access_chain_indexes) {
              uVar7 = bVar5 | 4;
              goto LAB_0064656e;
            }
          }
          ValidationState_t::diag
                    ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"The number of indexes in ",0x19);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,(char *)local_280,lVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," may not exceed ",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)local_208);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,". Found ",8);
          std::ostream::_M_insert<unsigned_long>((ulong)local_208);
          pcVar9 = " indexes.";
          lVar16 = 9;
          goto LAB_006467be;
        }
      }
      else {
        if (!bVar5 || uVar2 != 0x1141) goto LAB_00646386;
        if ((pIVar11->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[2] ==
            (pIVar12->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[2]) goto LAB_00646336;
      }
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 "The result pointer storage class and base pointer storage class in ",0x43);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_280,lVar16);
      pcVar9 = " do not match.";
      lVar16 = 0xe;
      goto LAB_006467be;
    }
    ValidationState_t::diag
              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"The Result Type of ",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,(char *)local_280,lVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," <id> ",6);
    ValidationState_t::getIdName_abi_cxx11_
              (&local_258,_,
               *(uint32_t *)
                ((long)&(inst->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208," must be OpTypePointer. Found Op",0x20);
    local_228._M_dataplus._M_p = spvOpcodeString((uint)(pIVar11->inst_).opcode);
    pDVar13 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_228);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar13,".",1);
    sVar18 = pDVar13->error_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
  }
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
LAB_006467da:
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270 + 1);
  }
  return sVar18;
}

Assistant:

spv_result_t ValidateAccessChain(ValidationState_t& _,
                                 const Instruction* inst) {
  std::string instr_name =
      "Op" + std::string(spvOpcodeString(static_cast<spv::Op>(inst->opcode())));

  const bool untyped_pointer = spvOpcodeGeneratesUntypedPointer(inst->opcode());

  // The result type must be OpTypePointer for regular access chains and an
  // OpTypeUntypedPointerKHR for untyped access chains.
  auto result_type = _.FindDef(inst->type_id());
  if (untyped_pointer) {
    if (!result_type ||
        spv::Op::OpTypeUntypedPointerKHR != result_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "The Result Type of " << instr_name << " <id> "
             << _.getIdName(inst->id())
             << " must be OpTypeUntypedPointerKHR. Found Op"
             << spvOpcodeString(static_cast<spv::Op>(result_type->opcode()))
             << ".";
    }
  } else {
    if (!result_type || spv::Op::OpTypePointer != result_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "The Result Type of " << instr_name << " <id> "
             << _.getIdName(inst->id()) << " must be OpTypePointer. Found Op"
             << spvOpcodeString(static_cast<spv::Op>(result_type->opcode()))
             << ".";
    }
  }

  if (untyped_pointer) {
    // Base type must be a non-pointer type.
    const auto base_type = _.FindDef(inst->GetOperandAs<uint32_t>(2));
    if (!base_type || !spvOpcodeGeneratesType(base_type->opcode()) ||
        base_type->opcode() == spv::Op::OpTypePointer ||
        base_type->opcode() == spv::Op::OpTypeUntypedPointerKHR) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Base type must be a non-pointer type";
    }
  }

  // Base must be a pointer, pointing to the base of a composite object.
  const auto base_index = untyped_pointer ? 3 : 2;
  const auto base_id = inst->GetOperandAs<uint32_t>(base_index);
  const auto base = _.FindDef(base_id);
  const auto base_type = _.FindDef(base->type_id());
  if (!base_type || !(spv::Op::OpTypePointer == base_type->opcode() ||
                      (untyped_pointer && spv::Op::OpTypeUntypedPointerKHR ==
                                              base_type->opcode()))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The Base <id> " << _.getIdName(base_id) << " in " << instr_name
           << " instruction must be a pointer.";
  }

  // The result pointer storage class and base pointer storage class must match.
  // Word 2 of OpTypePointer is the Storage Class.
  auto result_type_storage_class = result_type->word(2);
  auto base_type_storage_class = base_type->word(2);
  if (result_type_storage_class != base_type_storage_class) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The result pointer storage class and base "
              "pointer storage class in "
           << instr_name << " do not match.";
  }

  // The type pointed to by OpTypePointer (word 3) must be a composite type.
  auto type_pointee = untyped_pointer
                          ? _.FindDef(inst->GetOperandAs<uint32_t>(2))
                          : _.FindDef(base_type->word(3));

  // Check Universal Limit (SPIR-V Spec. Section 2.17).
  // The number of indexes passed to OpAccessChain may not exceed 255
  // The instruction includes 4 words + N words (for N indexes)
  size_t num_indexes = inst->words().size() - 4;
  if (inst->opcode() == spv::Op::OpPtrAccessChain ||
      inst->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
      inst->opcode() == spv::Op::OpUntypedPtrAccessChainKHR ||
      inst->opcode() == spv::Op::OpUntypedInBoundsPtrAccessChainKHR) {
    // In pointer access chains, the element operand is required, but not
    // counted as an index.
    --num_indexes;
  }
  const size_t num_indexes_limit =
      _.options()->universal_limits_.max_access_chain_indexes;
  if (num_indexes > num_indexes_limit) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The number of indexes in " << instr_name << " may not exceed "
           << num_indexes_limit << ". Found " << num_indexes << " indexes.";
  }
  // Indexes walk the type hierarchy to the desired depth, potentially down to
  // scalar granularity. The first index in Indexes will select the top-level
  // member/element/component/element of the base composite. All composite
  // constituents use zero-based numbering, as described by their OpType...
  // instruction. The second index will apply similarly to that result, and so
  // on. Once any non-composite type is reached, there must be no remaining
  // (unused) indexes.
  auto starting_index = untyped_pointer ? 5 : 4;
  if (inst->opcode() == spv::Op::OpPtrAccessChain ||
      inst->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
      inst->opcode() == spv::Op::OpUntypedPtrAccessChainKHR ||
      inst->opcode() == spv::Op::OpUntypedInBoundsPtrAccessChainKHR) {
    ++starting_index;
  }
  for (size_t i = starting_index; i < inst->words().size(); ++i) {
    const uint32_t cur_word = inst->words()[i];
    // Earlier ID checks ensure that cur_word definition exists.
    auto cur_word_instr = _.FindDef(cur_word);
    // The index must be a scalar integer type (See OpAccessChain in the Spec.)
    auto index_type = _.FindDef(cur_word_instr->type_id());
    if (!index_type || spv::Op::OpTypeInt != index_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Indexes passed to " << instr_name
             << " must be of type integer.";
    }
    switch (type_pointee->opcode()) {
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeCooperativeVectorNV:
      case spv::Op::OpTypeCooperativeMatrixNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeNodePayloadArrayAMDX: {
        // In OpTypeMatrix, OpTypeVector, spv::Op::OpTypeCooperativeMatrixNV,
        // OpTypeCooperativeVectorNV, OpTypeArray, and OpTypeRuntimeArray, word
        // 2 is the Element Type.
        type_pointee = _.FindDef(type_pointee->word(2));
        break;
      }
      case spv::Op::OpTypeStruct: {
        // In case of structures, there is an additional constraint on the
        // index: the index must be an OpConstant.
        int64_t cur_index;
        if (!_.EvalConstantValInt64(cur_word, &cur_index)) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "The <id> passed to " << instr_name << " to index "
                 << _.getIdName(cur_word)
                 << " into a "
                    "structure must be an OpConstant.";
        }

        // The index points to the struct member we want, therefore, the index
        // should be less than the number of struct members.
        const int64_t num_struct_members =
            static_cast<int64_t>(type_pointee->words().size() - 2);
        if (cur_index >= num_struct_members || cur_index < 0) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "Index " << _.getIdName(cur_word)
                 << " is out of bounds: " << instr_name << " cannot find index "
                 << cur_index << " into the structure <id> "
                 << _.getIdName(type_pointee->id()) << ". This structure has "
                 << num_struct_members << " members. Largest valid index is "
                 << num_struct_members - 1 << ".";
        }
        // Struct members IDs start at word 2 of OpTypeStruct.
        const size_t word_index = static_cast<size_t>(cur_index) + 2;
        auto structMemberId = type_pointee->word(word_index);
        type_pointee = _.FindDef(structMemberId);
        break;
      }
      default: {
        // Give an error. reached non-composite type while indexes still remain.
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << instr_name
               << " reached non-composite type while indexes "
                  "still remain to be traversed.";
      }
    }
  }

  if (!untyped_pointer) {
    // Result type is a pointer. Find out what it's pointing to.
    // This will be used to make sure the indexing results in the same type.
    // OpTypePointer word 3 is the type being pointed to.
    const auto result_type_pointee = _.FindDef(result_type->word(3));
    // At this point, we have fully walked down from the base using the indeces.
    // The type being pointed to should be the same as the result type.
    if (type_pointee->id() != result_type_pointee->id()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << instr_name << " result type (Op"
             << spvOpcodeString(
                    static_cast<spv::Op>(result_type_pointee->opcode()))
             << ") does not match the type that results from indexing into the "
                "base "
                "<id> (Op"
             << spvOpcodeString(static_cast<spv::Op>(type_pointee->opcode()))
             << ").";
    }
  }

  return SPV_SUCCESS;
}